

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O3

void __thiscall TPZFileEqnStorage<float>::Zero(TPZFileEqnStorage<float> *this)

{
  char *pcVar1;
  int __fd;
  size_t sVar2;
  FILE *__s;
  int zero;
  undefined4 local_34;
  
  if (this->fIOStream != (FILE *)0x0) {
    FinishWriting(this);
  }
  remove((this->fFileName)._M_dataplus._M_p);
  builtin_strncpy(filenamestorage,"/tmp/binary_frontalXXXXXX",0x1a);
  __fd = mkstemp(filenamestorage);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Temporary file name ",0x14);
  sVar2 = strlen(filenamestorage);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,filenamestorage,sVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  std::ostream::flush();
  TPZManVector<long,_10>::Resize(&(this->fBlockPos).super_TPZManVector<long,_10>,0);
  this->fNumBlocks = 0;
  this->fCurrentBlock = 0;
  this->fCurBlockPosition = -1;
  this->fNumHeaders = 0x14;
  pcVar1 = (char *)(this->fFileName)._M_string_length;
  strlen(filenamestorage);
  std::__cxx11::string::_M_replace((ulong)&this->fFileName,0,pcVar1,0x1a32fe0);
  __s = fdopen(__fd,"wb");
  this->fIOStream = (FILE *)__s;
  local_34 = 0;
  fwrite(&this->fNumHeaders,4,1,__s);
  fwrite(&local_34,4,1,(FILE *)this->fIOStream);
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::Zero()
{
	if(fIOStream) FinishWriting();
	remove(fFileName.c_str());
	
	strcpy(filenamestorage, "/tmp/binary_frontalXXXXXX");
	
	int fdtmp = -1;
#ifdef WIN32
	_mktemp(filenamestorage);
#else
	fdtmp = mkstemp(filenamestorage); //returns file description for tmp file
#endif
	cout << "Temporary file name " << filenamestorage << endl;
	cout.flush();
	
	fBlockPos.Resize(0);
	fCurBlockPosition = -1;
	fNumBlocks=0;
	fCurrentBlock=0;
	fNumHeaders=20;
	
	fFileName = filenamestorage;
#ifdef WIN32
	fIOStream = fopen(filenamestorage,"wb"); //open for writing
#else
	fIOStream = fdopen(fdtmp,"wb"); //open for writing
#endif
	/**
	 *Writes NumHeaders and NumBlocks information in
	 *the two initial positions on fIOStream
	 */
	int zero = 0;
	fwrite(&fNumHeaders,sizeof(int),1,fIOStream);
	fwrite(&zero,sizeof(int),1,fIOStream);
}